

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Test_cancelled(MPIABI_Status *status,int *flag)

{
  int iVar1;
  WPI_const_StatusPtr local_10;
  
  local_10.wrapped_status_ptr = (WPI_Status *)status;
  iVar1 = MPI_Test_cancelled();
  WPI_const_StatusPtr::~WPI_const_StatusPtr(&local_10);
  return iVar1;
}

Assistant:

int MPIABI_Test_cancelled(
  const MPIABI_Status * status,
  int * flag
) {
  return MPI_Test_cancelled(
    (const MPI_Status *)(WPI_const_StatusPtr)status,
    flag
  );
}